

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::UninterpretedOption::UninterpretedOption
          (UninterpretedOption *this,UninterpretedOption *from)

{
  bool bVar1;
  InternalMetadataWithArena *this_00;
  string *psVar2;
  string *this_01;
  UninterpretedOption *this_02;
  Arena *arena;
  UninterpretedOption *in_RSI;
  undefined8 *in_RDI;
  Arena *in_stack_fffffffffffffeb8;
  UninterpretedOption *in_stack_fffffffffffffec0;
  string *in_stack_fffffffffffffec8;
  RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart> *in_stack_fffffffffffffed0;
  
  Message::Message(&in_stack_fffffffffffffec0->super_Message);
  *in_RDI = &PTR__UninterpretedOption_009640b0;
  internal::InternalMetadataWithArena::InternalMetadataWithArena
            ((InternalMetadataWithArena *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  *(uint32 *)(in_RDI + 2) = (in_RSI->_has_bits_).has_bits_[0];
  internal::CachedSize::CachedSize((CachedSize *)0x52ac64);
  RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::RepeatedPtrField
            (in_stack_fffffffffffffed0,
             (RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart> *)
             in_stack_fffffffffffffec8);
  this_00 = &in_RSI->_internal_metadata_;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) == 1) {
      internal::
      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
      ::
      PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                  *)this_00);
    }
    else {
      internal::InternalMetadataWithArena::default_instance();
    }
    internal::InternalMetadataWithArena::DoMergeFrom
              ((InternalMetadataWithArena *)in_stack_fffffffffffffec0,
               (UnknownFieldSet *)in_stack_fffffffffffffeb8);
  }
  psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::UnsafeSetDefault((ArenaStringPtr *)(in_RDI + 6),psVar2);
  bVar1 = _internal_has_identifier_value(in_RSI);
  if (bVar1) {
    internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    _internal_identifier_value_abi_cxx11_((UninterpretedOption *)0x52ae4c);
    GetArenaNoVirtual(in_stack_fffffffffffffec0);
    internal::ArenaStringPtr::Set
              ((ArenaStringPtr *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
               (string *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  }
  psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::UnsafeSetDefault((ArenaStringPtr *)(in_RDI + 7),psVar2);
  bVar1 = _internal_has_string_value(in_RSI);
  if (bVar1) {
    internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    _internal_string_value_abi_cxx11_((UninterpretedOption *)0x52af57);
    GetArenaNoVirtual(in_stack_fffffffffffffec0);
    internal::ArenaStringPtr::Set
              ((ArenaStringPtr *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
               (string *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  }
  psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::UnsafeSetDefault((ArenaStringPtr *)(in_RDI + 8),psVar2);
  bVar1 = _internal_has_aggregate_value(in_RSI);
  if (bVar1) {
    psVar2 = (string *)(in_RDI + 8);
    this_01 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    this_02 = (UninterpretedOption *)
              _internal_aggregate_value_abi_cxx11_((UninterpretedOption *)0x52b004);
    arena = GetArenaNoVirtual(this_02);
    internal::ArenaStringPtr::Set((ArenaStringPtr *)this_01,psVar2,(string *)this_02,arena);
  }
  memcpy(in_RDI + 9,&in_RSI->positive_int_value_,0x18);
  return;
}

Assistant:

UninterpretedOption::UninterpretedOption(const UninterpretedOption& from)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
      _internal_metadata_(nullptr),
      _has_bits_(from._has_bits_),
      name_(from.name_) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  identifier_value_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_identifier_value()) {
    identifier_value_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_identifier_value(),
      GetArenaNoVirtual());
  }
  string_value_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_string_value()) {
    string_value_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_string_value(),
      GetArenaNoVirtual());
  }
  aggregate_value_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_aggregate_value()) {
    aggregate_value_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_aggregate_value(),
      GetArenaNoVirtual());
  }
  ::memcpy(&positive_int_value_, &from.positive_int_value_,
    static_cast<size_t>(reinterpret_cast<char*>(&double_value_) -
    reinterpret_cast<char*>(&positive_int_value_)) + sizeof(double_value_));
  // @@protoc_insertion_point(copy_constructor:google.protobuf.UninterpretedOption)
}